

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.c
# Opt level: O0

void * lys_ext_complex_get_substmt(LY_STMT stmt,lys_ext_instance_complex *ext,lyext_substmt **info)

{
  LY_ERR *pLVar1;
  int local_2c;
  int i;
  lyext_substmt **info_local;
  lys_ext_instance_complex *ext_local;
  void *pvStack_10;
  LY_STMT stmt_local;
  
  if ((((ext == (lys_ext_instance_complex *)0x0) || (ext->def == (lys_ext *)0x0)) ||
      (ext->def->plugin == (lyext_plugin *)0x0)) || (ext->def->plugin->type != LYEXT_COMPLEX)) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    pvStack_10 = (void *)0x0;
  }
  else if (ext->substmt == (lyext_substmt *)0x0) {
    if (info != (lyext_substmt **)0x0) {
      *info = (lyext_substmt *)0x0;
    }
    pvStack_10 = (void *)0x0;
  }
  else {
    local_2c = 0;
    while (ext->substmt[local_2c].stmt != LY_STMT_UNKNOWN) {
      if (stmt == LY_STMT_NODE) {
        if ((LY_STMT_MODULE < ext->substmt[local_2c].stmt) &&
           (ext->substmt[local_2c].stmt < LY_STMT_TYPEDEF)) {
          if (info != (lyext_substmt **)0x0) {
            *info = ext->substmt + local_2c;
          }
          break;
        }
      }
      else if (ext->substmt[local_2c].stmt == stmt) {
        if (info != (lyext_substmt **)0x0) {
          *info = ext->substmt + local_2c;
        }
        break;
      }
      local_2c = local_2c + 1;
    }
    if (ext->substmt[local_2c].stmt == LY_STMT_UNKNOWN) {
      pvStack_10 = (void *)0x0;
    }
    else {
      pvStack_10 = &ext->field_0x3c + ext->substmt[local_2c].offset;
    }
  }
  return pvStack_10;
}

Assistant:

API void *
lys_ext_complex_get_substmt(LY_STMT stmt, struct lys_ext_instance_complex *ext, struct lyext_substmt **info)
{
    int i;

    if (!ext || !ext->def || !ext->def->plugin || ext->def->plugin->type != LYEXT_COMPLEX) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (!ext->substmt) {
        /* no substatement defined in the plugin */
        if (info) {
            *info = NULL;
        }
        return NULL;
    }

    /* search the substatements defined by the plugin */
    for (i = 0; ext->substmt[i].stmt; i++) {
        if (stmt == LY_STMT_NODE) {
            if (ext->substmt[i].stmt >= LY_STMT_ACTION && ext->substmt[i].stmt <= LY_STMT_USES) {
                if (info) {
                    *info = &ext->substmt[i];
                }
                break;
            }
        } else if (ext->substmt[i].stmt == stmt) {
            if (info) {
                *info = &ext->substmt[i];
            }
            break;
        }
    }

    if (ext->substmt[i].stmt) {
        return &ext->content[ext->substmt[i].offset];
    } else {
        return NULL;
    }
}